

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::EnhancedLayouts::TextureTestBase::getPassSnippet_abi_cxx11_
          (string *__return_storage_ptr__,TextureTestBase *this,GLuint param_1,
          VaryingPassthrough *varying_passthrough,STAGES stage)

{
  pointer pVVar1;
  Variable *pVVar2;
  Variable *pVVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  FLAVOUR in_flavour;
  allocator<char> local_c2;
  allocator<char> local_c1;
  string *local_c0;
  size_t position;
  ulong local_b0;
  TextureTestBase *local_a8;
  Vector *local_a0;
  ulong local_98;
  string passthrough;
  string local_70;
  string local_50;
  
  local_a8 = this;
  if (stage == COMPUTE) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,glcts::fixed_sample_locations_values + 1,
               (allocator<char> *)&passthrough);
  }
  else {
    local_a0 = Utils::VaryingPassthrough::Get(varying_passthrough,stage);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"LIST",(allocator<char> *)&passthrough);
    position = 0;
    uVar6 = (ulong)(stage - TESS_CTRL);
    uVar4 = 0;
    local_c0 = __return_storage_ptr__;
    local_b0 = uVar6;
    while( true ) {
      uVar5 = (ulong)uVar4;
      pVVar1 = (local_a0->
               super__Vector_base<gl4cts::EnhancedLayouts::Utils::VaryingConnection,_std::allocator<gl4cts::EnhancedLayouts::Utils::VaryingConnection>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(local_a0->
                        super__Vector_base<gl4cts::EnhancedLayouts::Utils::VaryingConnection,_std::allocator<gl4cts::EnhancedLayouts::Utils::VaryingConnection>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1 >> 4) <= uVar5)
      break;
      in_flavour = BASIC;
      local_98 = 0;
      if ((uint)uVar6 < 3) {
        in_flavour = *(FLAVOUR *)(&DAT_0165218c + uVar6 * 4);
        local_98 = (ulong)*(uint *)(&DAT_01652180 + uVar6 * 4);
      }
      pVVar2 = pVVar1[uVar5].m_in;
      pVVar3 = pVVar1[uVar5].m_out;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,glcts::fixed_sample_locations_values + 1,&local_c1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,glcts::fixed_sample_locations_values + 1,&local_c2);
      getVariablePassthrough
                (&passthrough,local_a8,&local_70,&pVVar2->m_descriptor,in_flavour,&local_50,
                 &pVVar3->m_descriptor,(FLAVOUR)local_98);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      __return_storage_ptr__ = local_c0;
      Utils::insertElementOfList(passthrough._M_dataplus._M_p,"\n    ",&position,local_c0);
      uVar6 = local_b0;
      std::__cxx11::string::~string((string *)&passthrough);
      uVar4 = uVar4 + 1;
    }
    Utils::endList(glcts::fixed_sample_locations_values + 1,&position,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TextureTestBase::getPassSnippet(GLuint /* test_case_index */,
											Utils::VaryingPassthrough& varying_passthrough, Utils::Shader::STAGES stage)
{
	static const GLchar* separator = "\n    ";

	/* Skip for compute shader */
	if (Utils::Shader::COMPUTE == stage)
	{
		return "";
	}

	Utils::VaryingConnection::Vector& vector = varying_passthrough.Get(stage);

	std::string result   = Utils::g_list;
	size_t		position = 0;

	for (GLuint i = 0; i < vector.size(); ++i)
	{

		Utils::VaryingConnection& connection = vector[i];

		Utils::Variable* in  = connection.m_in;
		Utils::Variable* out = connection.m_out;

		Utils::Variable::FLAVOUR in_flavour  = Utils::Variable::GetFlavour(stage, Utils::Variable::INPUT);
		Utils::Variable::FLAVOUR out_flavour = Utils::Variable::GetFlavour(stage, Utils::Variable::OUTPUT);

		const std::string passthrough =
			getVariablePassthrough("", in->m_descriptor, in_flavour, "", out->m_descriptor, out_flavour);

		Utils::insertElementOfList(passthrough.c_str(), separator, position, result);
	}

	Utils::endList("", position, result);

	return result;
}